

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetUserVar
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint uVar1;
  bool bVar2;
  PField *pPVar3;
  DObject *this;
  char *pcVar4;
  FName local_1c;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003e91d3;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (DObject *)0x0) {
        bVar2 = DObject::IsKindOf(this,DObject::RegistrationInfo.MyClass);
        if (!bVar2) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DObject))";
          goto LAB_003e91d3;
        }
        goto LAB_003e9169;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_003e91c3;
    this = (DObject *)0x0;
LAB_003e9169:
    if (numparam == 1) {
      pcVar4 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        if ((uint)numparam < 3) {
          pcVar4 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\0') {
            local_1c.Index = param[1].field_0.i;
            uVar1 = param[2].field_0.i;
            pPVar3 = GetVar(this,&local_1c);
            if (pPVar3 != (PField *)0x0) {
              (*(pPVar3->Type->super_PTypeBase).super_DObject._vptr_DObject[0xf])
                        (pPVar3->Type,(long)&this->_vptr_DObject + pPVar3->Offset,(ulong)uVar1);
            }
            return 0;
          }
          pcVar4 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1304,
                      "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar4 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1303,
                  "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003e91c3:
  pcVar4 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003e91d3:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1302,
                "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetUserVar)
{
	PARAM_SELF_PROLOGUE(DObject);
	PARAM_NAME	(varname);
	PARAM_INT	(value);

	// Set the value of the specified user variable.
	PField *var = GetVar(self, varname);
	if (var != nullptr)
	{
		var->Type->SetValue(reinterpret_cast<BYTE *>(self) + var->Offset, value);
	}
	return 0;
}